

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O1

Iterator __thiscall
axl::sl::
HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
::visit(HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
        *this,char key)

{
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
  *this_00;
  Bucket *pBVar1;
  size_t *psVar2;
  Entry *pEVar3;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *pHVar4;
  bool bVar5;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  IVar6;
  HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
  *pHVar7;
  ListLink *pLVar8;
  AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *pAVar9;
  size_t sVar10;
  ListLink *link;
  
  this_00 = &this->m_table;
  sVar10 = (this->m_table).
           super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
           .m_count;
  if (sVar10 == 0) {
    sVar10 = 0x20;
    bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
                        *)this_00,0x20);
    if (!bVar5) {
      return (Iterator)(Entry *)0x0;
    }
  }
  bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
          ::ensureExclusive(this_00);
  pAVar9 = (AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
            *)0x0;
  if (bVar5) {
    pAVar9 = (this_00->
             super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ).m_p;
  }
  IVar6.m_p = pAVar9[(ulong)(long)key % sVar10].
              super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
              .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head;
  pEVar3 = IVar6.m_p;
  while( true ) {
    if (pEVar3 == (Entry *)0x0) {
      pBVar1 = pAVar9 + (ulong)(long)key % sVar10;
      IVar6.m_p = (Entry *)operator_new(0x38);
      *(undefined8 *)&((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_key = 0;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_value = (SwitchInfo *)0x0;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).super_ListLink.m_next =
           (ListLink *)0x0;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).super_ListLink.m_prev =
           (ListLink *)0x0;
      ((IVar6.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
      ((IVar6.m_p)->m_bucketLink).m_prev = (ListLink *)0x0;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_key = key;
      (IVar6.m_p)->m_bucket = pBVar1;
      pHVar7 = (HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
                *)(this->m_list).
                  super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
                  .
                  super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
                  .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).super_ListLink.m_next =
           (ListLink *)0x0;
      ((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).super_ListLink.m_prev =
           (ListLink *)pHVar7;
      if (pHVar7 == (HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
                     *)0x0) {
        pHVar7 = this;
      }
      (pHVar7->m_list).
      super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head = IVar6.m_p;
      (this->m_list).
      super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail = IVar6.m_p;
      psVar2 = &(this->m_list).
                super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
                .
                super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
                .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count;
      *psVar2 = *psVar2 + 1;
      pHVar4 = (pBVar1->
               super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
               ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail;
      pLVar8 = &pHVar4->m_bucketLink;
      if (pHVar4 == (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)0x0) {
        pLVar8 = (ListLink *)0x0;
      }
      ((IVar6.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
      ((IVar6.m_p)->m_bucketLink).m_prev = pLVar8;
      if (pHVar4 == (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)0x0) {
        (pBVar1->
        super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
        ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head = IVar6.m_p;
      }
      else {
        pLVar8->m_next = &(IVar6.m_p)->m_bucketLink;
      }
      (pBVar1->
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
      ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail = IVar6.m_p;
      psVar2 = &(pBVar1->
                super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count;
      *psVar2 = *psVar2 + 1;
      if (this->m_resizeThreshold <
          ((this->m_list).
           super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
           .
           super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
           .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count * 100) /
          sVar10) {
        setBucketCount(this,sVar10 * 2);
      }
      return (Iterator)IVar6.m_p;
    }
    if (((IVar6.m_p)->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_key == key) break;
    pEVar3 = (Entry *)((IVar6.m_p)->m_bucketLink).m_next;
    IVar6.m_p = (Entry *)&pEVar3[-1].super_MapEntry<char,_axl::sl::SwitchInfo_*>.m_value;
  }
  return (Iterator)IVar6.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}